

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismModel::_build_exact_path_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,uint number_of_exact_path_graphs,bool directed,bool at_most,
          bool pattern)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  SVOBitset *in_RCX;
  uint in_EDX;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *in_RSI;
  long in_RDI;
  uint in_R8D;
  byte in_R9B;
  bool bVar4;
  bool bVar5;
  byte in_stack_00000008;
  byte in_stack_00000010;
  uint p_1;
  uint p;
  uint path_count;
  uint w_1;
  uint v_1;
  uint w;
  value_type nc;
  uint c;
  value_type nv;
  uint v;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path_counts;
  SVOBitset *in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd4;
  uint in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffddc;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  uint in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde4;
  size_type in_stack_fffffffffffffde8;
  SVOBitset *this_00;
  uint local_1a8;
  uint local_1a4;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_104;
  uint local_74;
  undefined1 local_6d [45];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_40 [2];
  undefined8 local_10;
  
  local_40[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = in_R9B & 1;
  local_40[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_1_ = in_stack_00000008 & 1;
  local_40[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = in_stack_00000010 & 1;
  local_6d._17_4_ = 0;
  local_40[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_R8D;
  local_40[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX;
  local_40[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_EDX;
  local_10 = in_RSI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14b8ec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,in_stack_fffffffffffffde8
             ,(value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))));
  this_00 = (SVOBitset *)local_6d;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x14b91f);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_RCX,(size_type)this_00,
           (value_type *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
           (allocator_type *)
           CONCAT17(in_stack_fffffffffffffddf,
                    CONCAT16(in_stack_fffffffffffffdde,
                             CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)local_6d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)(local_6d + 0x10));
  for (local_74 = 0;
      local_74 <
      (uint)local_40[1].
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_74 = local_74 + 1) {
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)local_10
               ,(ulong)(local_74 * *(int *)(in_RDI + 8)));
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    if ((local_40[1].
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._2_1_ & 1) != 0) {
      SVOBitset::set(in_RCX,(int)((ulong)this_00 >> 0x20));
    }
    in_stack_fffffffffffffde4 = SVOBitset::find_first(this_00);
    local_104 = in_stack_fffffffffffffde4;
    while (local_104 != 0xffffffff) {
      SVOBitset::reset(in_RCX,(int)((ulong)this_00 >> 0x20));
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                 local_10,(ulong)(local_104 * *(int *)(in_RDI + 8)));
      SVOBitset::SVOBitset
                ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
      if ((local_40[1].
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._2_1_ & 1) != 0) {
        SVOBitset::set(in_RCX,(int)((ulong)this_00 >> 0x20));
      }
      in_stack_fffffffffffffde0 = SVOBitset::find_first(this_00);
      local_194 = in_stack_fffffffffffffde0;
      while( true ) {
        bVar4 = local_194 != 0xffffffff;
        if (bVar4) {
          in_stack_fffffffffffffdde =
               (local_40[1].
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start._3_1_ & 1) != 0 || local_194 <= local_74;
        }
        bVar5 = (local_40[1].
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._3_1_ & 1) != 0;
        in_stack_fffffffffffffddf = bVar4 && (bVar5 || local_194 <= local_74);
        if (!bVar4 || !bVar5 && local_194 > local_74) break;
        SVOBitset::reset(in_RCX,(int)((ulong)this_00 >> 0x20));
        pvVar2 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](local_40,(ulong)local_74);
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar2,(ulong)local_194);
        *pvVar3 = *pvVar3 + 1;
        in_stack_fffffffffffffdd8 = SVOBitset::find_first(this_00);
        local_194 = in_stack_fffffffffffffdd8;
      }
      SVOBitset::~SVOBitset
                ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      in_stack_fffffffffffffdd4 = SVOBitset::find_first(this_00);
      local_104 = in_stack_fffffffffffffdd4;
    }
    SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  }
  for (local_198 = 0;
      local_198 <
      (uint)local_40[1].
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_198 = local_198 + 1) {
    in_stack_fffffffffffffdd0 = local_198;
    local_19c = local_198;
    if ((local_40[1].
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._3_1_ & 1) != 0) {
      local_19c = 0;
      in_stack_fffffffffffffdd0 = local_19c;
    }
    for (; local_19c <
           (uint)local_40[1].
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_19c = local_19c + 1
        ) {
      if (((local_40[1].
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._2_1_ & 1) == 0) || (local_198 != local_19c))
      {
        pvVar2 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](local_40,(ulong)local_19c);
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar2,(ulong)local_198);
        uVar1 = *pvVar3;
        for (local_1a4 = 1;
            local_1a4 <=
            (uint)local_40[1].
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_; local_1a4 = local_1a4 + 1) {
          if (local_1a4 <= uVar1) {
            std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
            operator[]((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                       local_10,(ulong)((local_1a4 - 1) +
                                       local_198 * *(int *)(in_RDI + 8) +
                                       *(int *)local_40[1].
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish));
            SVOBitset::set(in_RCX,(int)((ulong)this_00 >> 0x20));
            if ((local_40[1].
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._3_1_ & 1) == 0) {
              std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
              operator[]((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                          *)local_10,
                         (ulong)((local_1a4 - 1) +
                                local_19c * *(int *)(in_RDI + 8) +
                                *(int *)local_40[1].
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish));
              SVOBitset::set(in_RCX,(int)((ulong)this_00 >> 0x20));
            }
          }
        }
      }
      else {
        std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                  ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                   local_10,(ulong)(local_198 * *(int *)(in_RDI + 8) +
                                   *(int *)local_40[1].
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish));
        SVOBitset::set(in_RCX,(int)((ulong)this_00 >> 0x20));
      }
    }
  }
  if ((local_40[1].
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_1_ & 1) != 0) {
    for (local_1a8 = 1;
        local_1a8 <=
        (uint)local_40[1].
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_; local_1a8 = local_1a8 + 1) {
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14be9e);
      std::__cxx11::to_string(in_EDX);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffddf,
                                      CONCAT16(in_stack_fffffffffffffdde,
                                               CONCAT24(in_stack_fffffffffffffddc,
                                                        in_stack_fffffffffffffdd8))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  (value_type *)
                  CONCAT17(in_stack_fffffffffffffddf,
                           CONCAT16(in_stack_fffffffffffffdde,
                                    CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))))
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    }
  }
  *(int *)local_40[1].
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
       local_40[1].
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_ +
       *(int *)local_40[1].
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  return;
}

Assistant:

auto HomomorphismModel::_build_exact_path_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
    unsigned number_of_exact_path_graphs, bool directed, bool at_most, bool pattern) -> void
{
    vector<vector<unsigned>> path_counts(size, vector<unsigned>(size, 0));

    // count number of paths from w to v (unless directed, only w >= v, so not v to w)
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        if (at_most)
            nv.set(v);
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            if (at_most)
                nc.set(c);
            for (auto w = nc.find_first(); w != decltype(nc)::npos && (directed ? true : w <= v); w = nc.find_first()) {
                nc.reset(w);
                ++path_counts[v][w];
            }
        }
    }

    for (unsigned v = 0; v < size; ++v) {
        for (unsigned w = (directed ? 0 : v); w < size; ++w) {
            if (at_most && v == w)
                graph_rows[v * max_graphs + idx].set(w);
            else {
                // unless directed, w to v, not v to w, see above
                unsigned path_count = path_counts[w][v];
                for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p) {
                    if (path_count >= p) {
                        graph_rows[v * max_graphs + idx + p - 1].set(w);
                        if (! directed)
                            graph_rows[w * max_graphs + idx + p - 1].set(v);
                    }
                }
            }
        }
    }

    if (pattern)
        for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p)
            _imp->supplemental_graph_names.push_back("exact_path_" + to_string(p));

    idx += number_of_exact_path_graphs;
}